

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> * __thiscall
Corrade::Utility::Path::anon_unknown_23::readInternal
          (Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>
           *__return_storage_ptr__,anon_unknown_23 *this,StringView filename,size_t extra)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  Debug *pDVar4;
  int *piVar5;
  Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *extraout_RAX;
  unsigned_long *puVar6;
  size_t sVar7;
  ostream *output;
  anon_union_24_2_2c69c8ed_for_String_0 *this_00;
  size_t count;
  StringView value;
  StringView value_00;
  Optional<unsigned_long> size_;
  ScopeGuard exit;
  Array<char,_void_(*)(char_*,_unsigned_long)> out;
  Error err;
  Optional<unsigned_long> local_110;
  Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *local_100;
  code *local_f8;
  FILE *local_f0;
  anon_union_24_2_2c69c8ed_for_String_0 local_e8;
  anon_union_24_2_2c69c8ed_for_String_0 local_c8;
  uint local_b0;
  
  value._sizePlusFlags = filename._data;
  Containers::String::nullTerminatedView((String *)&local_c8._small,(String *)this,filename);
  pcVar3 = Containers::String::data((String *)&local_c8._small);
  __stream = fopen(pcVar3,"rb");
  Containers::String::~String((String *)&local_c8._small);
  if (__stream == (FILE *)0x0) {
    Error::Error((Error *)&local_c8._small,(Flags)0x0);
    pDVar4 = Debug::operator<<((Debug *)&local_c8._small,"Utility::Path::read(): can\'t open");
    value_00._sizePlusFlags = (size_t)value._sizePlusFlags;
    value_00._data = (char *)this;
    pDVar4 = Debug::operator<<(pDVar4,value_00);
    (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
    Debug::operator<<(pDVar4,":");
    piVar5 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)&local_c8._small,*piVar5);
    __return_storage_ptr__->_set = false;
    Error::~Error((Error *)&local_c8._small);
    local_100 = extraout_RAX;
  }
  else {
    local_f8 = fclose;
    local_100 = (Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *)
                Containers::ScopeGuard::ScopeGuard<_IO_FILE_*,_int_(*)(_IO_FILE_*)>::
                anon_class_1_0_00000001::__invoke;
    local_f0 = __stream;
    iVar2 = fileno(__stream);
    iVar2 = fstat(iVar2,(stat *)&local_c8._small);
    if ((iVar2 == 0) && ((local_b0 & 0xf000) == 0x4000)) {
      Error::Error((Error *)&local_c8._small,(Flags)0x0);
      pDVar4 = Debug::operator<<((Debug *)&local_c8._small,"Utility::Path::read():");
      value._data = (char *)this;
      pDVar4 = Debug::operator<<(pDVar4,value);
      Debug::operator<<(pDVar4,"is a directory");
      Error::~Error((Error *)&local_c8._small);
      __return_storage_ptr__->_set = false;
    }
    else {
      size((anon_unknown_23 *)&local_110,(FILE *)__stream);
      if (local_110._set == false) {
        local_c8._large.data = (char *)0x0;
        local_c8._large.deleter = (_func_void_char_ptr_size_t *)0x0;
        local_c8._large.size = 0;
        count = filename._sizePlusFlags + 0x1000;
        do {
          pcVar3 = Containers::Implementation::
                   arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>
                             ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&local_c8._small,count
                             );
          sVar7 = fread(pcVar3,1,0x1000,__stream);
          Containers::arrayRemoveSuffix<char,Corrade::Containers::ArrayMallocAllocator<char>>
                    ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&local_c8._small,count - sVar7)
          ;
        } while (sVar7 != 0);
        __return_storage_ptr__->_set = true;
        this_00 = &local_c8;
        (__return_storage_ptr__->field_0)._value._data = local_c8._large.data;
        (__return_storage_ptr__->field_0)._value._size = (size_t)local_c8._large.deleter;
        (__return_storage_ptr__->field_0)._value._deleter =
             (_func_void_char_ptr_unsigned_long *)local_c8._large.size;
        local_c8._large.data = (char *)0x0;
        local_c8._large.deleter = (_func_void_char_ptr_size_t *)0x0;
        local_c8._large.size = 0;
      }
      else {
        puVar6 = Containers::Optional<unsigned_long>::operator*(&local_110);
        local_e8._large.deleter = (_func_void_char_ptr_size_t *)(filename._sizePlusFlags + *puVar6);
        if (local_e8._large.deleter == (_func_void_char_ptr_size_t *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = (char *)operator_new__((ulong)local_e8._large.deleter);
        }
        local_e8._large.size = 0;
        local_e8._large.data = pcVar3;
        puVar6 = Containers::Optional<unsigned_long>::operator*(&local_110);
        sVar7 = fread(pcVar3,1,*puVar6,__stream);
        puVar6 = Containers::Optional<unsigned_long>::operator*(&local_110);
        uVar1 = local_e8._large.data;
        if (*puVar6 < sVar7) {
          output = Error::defaultOutput();
          Error::Error((Error *)&local_c8._small,output,(Flags)0x0);
          Debug::operator<<((Debug *)&local_c8._small,
                            "Assertion realSize <= *size_ failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Path.cpp:1143"
                           );
          Error::~Error((Error *)&local_c8._small);
          abort();
        }
        this_00 = &local_e8;
        local_e8._large.data = (char *)0x0;
        local_e8._large.deleter = (_func_void_char_ptr_size_t *)0x0;
        local_e8._large.size = 0;
        __return_storage_ptr__->_set = true;
        (__return_storage_ptr__->field_0)._value._data = (char *)uVar1;
        (__return_storage_ptr__->field_0)._value._size = sVar7;
        (__return_storage_ptr__->field_0)._value._deleter = (_func_void_char_ptr_unsigned_long *)0x0
        ;
        local_c8._large.size = 0;
        local_c8._large.data = (char *)0x0;
        local_c8._large.deleter = (_func_void_char_ptr_size_t *)0x0;
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
                  ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&local_c8._small);
      }
      Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
                ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&this_00->_small);
    }
    if (local_100 !=
        (Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *)0x0) {
      local_100 = (Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *)
                  (*(code *)local_100)(&local_f8,&local_f0);
    }
  }
  return local_100;
}

Assistant:

Containers::Optional<Containers::Array<char>> readInternal(const Containers::StringView filename, std::size_t extra) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "rb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"rb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::read(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    Containers::ScopeGuard exit{f, std::fclose};

    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    /* Explicitly fail if opening directories for reading on Unix to prevent
       allocation failures or silent errors, see isDirectory(int) for details.
       On Windows the fopen() fails already. */
    if(isDirectory(fileno(f))) {
        Error{} << "Utility::Path::read():" << filename << "is a directory";
        return {};
    }
    #endif

    Containers::Optional<std::size_t> size_ = size(f);

    /* If the file is not seekable, read it in chunks. Read directly into the
       output array --- each time add uninitialized 4 kB at the end, pass that
       view to fread(), and then strip away what didn't get filled. Hey, do you
       like the growable array API as much as I do? :D */
    /** @todo that the loop works is only verifiable by setting the condition
        to if(true) and setting chunkSize to 1 -- I don't know about any large
        non-seekable file that could be used for this */
    if(!size_) {
        Containers::Array<char> out;
        constexpr std::size_t chunkSize = 4096;

        std::size_t count;
        do {
            count = std::fread(arrayAppend(out, NoInit, chunkSize + extra), 1, chunkSize, f);
            arrayRemoveSuffix(out, chunkSize + extra - count);
        } while(count);

        /* GCC 4.8 needs extra help here */
        return Containers::optional(Utility::move(out));
    }

    /* Some special files report more bytes than they actually have (such as
       stuff in /sys). Clamp the returned array to what was reported. */
    Containers::Array<char> out{NoInit, *size_ + extra};
    const std::size_t realSize = std::fread(out, 1, *size_, f);
    CORRADE_INTERNAL_ASSERT(realSize <= *size_);
    return Containers::Array<char>{out.release(), realSize};
}